

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

void __thiscall Parse::SMTLIB2::readDeclareSort(SMTLIB2 *this,string *name,string *arity)

{
  pointer pcVar1;
  Symbol *this_00;
  bool bVar2;
  uint uVar3;
  OperatorType *type;
  undefined8 *puVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  uint val;
  bool added;
  string pName;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined1 local_160 [48];
  bool local_130 [32];
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  bVar2 = isAlreadyKnownSymbol(this,&local_f0);
  if (bVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_160 + 0x10),"Redeclaring built-in, declared or defined sort symbol: ",name
                  );
    plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
    if (pbVar8 == pbVar6) {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
      local_160._8_8_ = plVar5[3];
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    }
    else {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    }
    *plVar5 = (long)pbVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_110,this->_topLevelExpr,true);
    std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    plVar5 = (long *)std::__cxx11::string::append(local_130);
    local_50 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_50 == plVar7) {
      local_40 = *plVar7;
      uStack_38 = (undefined4)plVar5[3];
      uStack_34 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar7;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    *puVar4 = &PTR_cry_00b3dfc0;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 1),local_50,local_48 + (long)local_50);
    *puVar4 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar4 + 5) = 0;
    puVar4[6] = puVar4 + 8;
    puVar4[7] = 0;
    *(undefined1 *)(puVar4 + 8) = 0;
    __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  pcVar1 = (arity->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + arity->_M_string_length);
  bVar2 = Lib::StringUtils::isPositiveInteger(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    bVar2 = Lib::Int::stringToUnsignedInt(arity,(uint *)&stack0xfffffffffffffe8c);
    if (bVar2) {
      uVar3 = Kernel::Signature::addTypeCon
                        (DAT_00b521b0,&local_f0,in_stack_fffffffffffffe8c,local_130);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_f0._M_dataplus._M_p,
                 local_f0._M_dataplus._M_p + local_f0._M_string_length);
      Lib::
      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(&this->_declaredSymbols,&local_d0,
               (pair<unsigned_int,_Parse::SMTLIB2::SymbolType>)((ulong)uVar3 | 0x200000000));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      this_00 = (DAT_00b521b0->_typeCons)._stack[uVar3];
      type = Kernel::OperatorType::getTypeConType(in_stack_fffffffffffffe8c);
      Kernel::Signature::Symbol::setType(this_00,type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_160 + 0x10),"Couldn\'t convert sort arity: ",arity);
    plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
    if (pbVar8 == pbVar6) {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
      local_160._8_8_ = plVar5[3];
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    }
    else {
      local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    }
    *plVar5 = (long)pbVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_110,this->_topLevelExpr,true);
    std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    plVar5 = (long *)std::__cxx11::string::append(local_130);
    local_90 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_90 == plVar7) {
      local_80 = *plVar7;
      uStack_78 = (undefined4)plVar5[3];
      uStack_74 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    *puVar4 = &PTR_cry_00b3dfc0;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 1),local_90,local_88 + (long)local_90);
    *puVar4 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar4 + 5) = 0;
    puVar4[6] = puVar4 + 8;
    puVar4[7] = 0;
    *(undefined1 *)(puVar4 + 8) = 0;
    __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_160 + 0x10),"Unrecognized declared sort arity: ",arity);
  plVar5 = (long *)std::__cxx11::string::append(local_160 + 0x10);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar5 + 2);
  if (pbVar8 == pbVar6) {
    local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
    local_160._8_8_ = plVar5[3];
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  }
  else {
    local_160._0_8_ = (pbVar6->_M_dataplus)._M_p;
  }
  *plVar5 = (long)pbVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_110,this->_topLevelExpr,true);
  std::operator+(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  plVar5 = (long *)std::__cxx11::string::append(local_130);
  local_70 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_70 == plVar7) {
    local_60 = *plVar7;
    uStack_58 = (undefined4)plVar5[3];
    uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *puVar4 = &PTR_cry_00b3dfc0;
  puVar4[1] = puVar4 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar4 + 1),local_70,local_68 + (long)local_70);
  *puVar4 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar4 + 5) = 0;
  puVar4[6] = puVar4 + 8;
  puVar4[7] = 0;
  *(undefined1 *)(puVar4 + 8) = 0;
  __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

void SMTLIB2::readDeclareSort(const std::string& name, const std::string& arity)
{
  std::string pName = name + TYPECON_POSTFIX;
  if (isAlreadyKnownSymbol(pName)) {
    USER_ERROR_EXPR("Redeclaring built-in, declared or defined sort symbol: "+name);
  }

  if (not StringUtils::isPositiveInteger(arity)) {
    USER_ERROR_EXPR("Unrecognized declared sort arity: "+arity);
  }

  unsigned val;
  if (!Int::stringToUnsignedInt(arity, val)) {
    USER_ERROR_EXPR("Couldn't convert sort arity: "+arity);
  }

  bool added;
  unsigned srt = env.signature->addTypeCon(pName,val,added);
  ASS(added);
  ALWAYS(_declaredSymbols.insert(pName,make_pair(srt,SymbolType::TYPECON)));
  env.signature->getTypeCon(srt)->setType(OperatorType::getTypeConType(val));
}